

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O2

int Nwk_ObjFindFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)pObj->nFanins;
  if (pObj->nFanins < 1) {
    uVar2 = uVar1;
  }
  while( true ) {
    if (uVar2 == uVar1) {
      return -1;
    }
    if (pObj->pFanio[uVar1] == (Nwk_Obj_t *)0x0) break;
    if (pObj->pFanio[uVar1] == pFanin) {
      return (int)uVar1;
    }
    uVar1 = uVar1 + 1;
  }
  return -1;
}

Assistant:

int Nwk_ObjFindFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{  
    Nwk_Obj_t * pTemp;
    int i;
    Nwk_ObjForEachFanin( pObj, pTemp, i )
        if ( pTemp == pFanin )
            return i;
    return -1;
}